

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_window.c
# Opt level: O0

ugui_window_t * text_window_create(uint32_t w,uint32_t h)

{
  ugui_rect_t bounds;
  ugui_layer_t *layer;
  ugui_layer_t *child;
  ugui_layer_t *text_widget_layer;
  ugui_layer_t *base_layer;
  uint32_t h_local;
  uint32_t w_local;
  
  text_window = ugui_window_create(w,h);
  bounds.y = (short)(h >> 3);
  bounds.x = (short)(w >> 3);
  bounds.w = (short)(w >> 3) * 6;
  bounds.h = (short)(h >> 3) * 6;
  text_widget = ugui_text_widget_create(bounds);
  ugui_text_widget_set_text(text_widget,&font_robotomono_regular_18,sample_one,'\0');
  layer = ugui_window_get_base_layer(text_window);
  child = ugui_text_widget_get_layer(text_widget);
  ugui_layer_add_child(layer,child);
  return text_window;
}

Assistant:

ugui_window_t *text_window_create(uint32_t w, uint32_t h)
{
	text_window = ugui_window_create(w, h);

	text_widget = ugui_text_widget_create((ugui_rect_t) {.x = w / 8, .y = h / 8, .w = w / 8 * 6, .h = h / 8 * 6});

	ugui_text_widget_set_text(text_widget, &font_robotomono_regular_18, sample_one, 0);

	ugui_layer_t* base_layer = ugui_window_get_base_layer(text_window);

	ugui_layer_t* text_widget_layer = ugui_text_widget_get_layer(text_widget);

	ugui_layer_add_child(base_layer, text_widget_layer);

	return text_window;
}